

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void anon_unknown.dwarf_ea51c5::addSegmentsToPath(Segment *segment,QPainterPath *path)

{
  long lVar1;
  QPointF *in_RSI;
  QPainterPath *in_RDI;
  long in_FS_OFFSET;
  Segment *last;
  Segment *current;
  QPoint *in_stack_ffffffffffffffa8;
  QPainterPath *local_48;
  QPainterPathPrivate *local_40;
  QPointF *p;
  QPainterPath *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RSI;
  this = in_RDI;
  QPointF::QPointF(in_RSI,in_stack_ffffffffffffffa8);
  QPainterPath::moveTo(this,p);
  *(byte *)&(in_RDI->d_ptr).d.ptr = *(byte *)&(in_RDI->d_ptr).d.ptr & 0xfd | 2;
  local_48 = in_RDI;
  for (local_40 = in_RDI[3].d_ptr.d.ptr; local_40 != (QPainterPathPrivate *)this;
      local_40 = (QPainterPathPrivate *)(local_40->elements).d.size) {
    if ((char)(*(char *)&(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> << 7) >> 7
        != (char)(*(char *)&(local_48->d_ptr).d.ptr << 7) >> 7) {
      QPointF::QPointF(in_RSI,(QPoint *)p);
      QPainterPath::lineTo(this,p);
    }
    *(byte *)&(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
         *(byte *)&(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> & 0xfd | 2;
    local_48 = (QPainterPath *)local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addSegmentsToPath(Segment *segment, QPainterPath &path)
{
    Segment *current = segment;
    path.moveTo(current->point);

    current->added = true;

    Segment *last = current;
    current = current->next;
    while (current != segment) {
        if (current->horizontal != last->horizontal)
            path.lineTo(current->point);
        current->added = true;
        last = current;
        current = current->next;
    }
}